

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O0

void __thiscall HEkkDualRow::setupSlice(HEkkDualRow *this,HighsInt size)

{
  char *pcVar1;
  double *pdVar2;
  int *piVar3;
  undefined4 in_ESI;
  long *in_RDI;
  undefined4 in_stack_00000008;
  
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  pcVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                     ((vector<signed_char,_std::allocator<signed_char>_> *)0x79e920);
  in_RDI[3] = (long)pcVar1;
  pdVar2 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x79e93e);
  in_RDI[4] = (long)pdVar2;
  pdVar2 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x79e95c);
  in_RDI[5] = (long)pdVar2;
  piVar3 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x79e97d);
  in_RDI[6] = (long)piVar3;
  *(undefined4 *)(in_RDI + 0xd) = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this,CONCAT44(size,in_stack_00000008));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,CONCAT44(size,in_stack_00000008));
  *(undefined4 *)((long)in_RDI + 0xc4) = 0;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::resize
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)this,
             CONCAT44(size,in_stack_00000008));
  in_RDI[0x29] = *in_RDI + 0x18;
  return;
}

Assistant:

void HEkkDualRow::setupSlice(HighsInt size) {
  workSize = size;
  workMove = ekk_instance_.basis_.nonbasicMove_.data();
  workDual = ekk_instance_.info_.workDual_.data();
  workRange = ekk_instance_.info_.workRange_.data();
  work_devex_index = ekk_instance_.info_.devex_index_.data();

  // Allocate spaces
  packCount = 0;
  packIndex.resize(workSize);
  packValue.resize(workSize);

  workCount = 0;
  workData.resize(workSize);
  analysis = &ekk_instance_.analysis_;
}